

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O0

Stats * __thiscall clunk::Stats::operator+=(Stats *this,Stats *other)

{
  Stats *other_local;
  Stats *this_local;
  
  this->statCount = this->statCount + 1;
  this->ttGets = other->ttGets + this->ttGets;
  this->ttHits = other->ttHits + this->ttHits;
  this->ttMates = other->ttMates + this->ttMates;
  this->ttStales = other->ttStales + this->ttStales;
  this->ptGets = other->ptGets + this->ptGets;
  this->ptHits = other->ptHits + this->ptHits;
  this->snodes = other->snodes + this->snodes;
  this->qnodes = other->qnodes + this->qnodes;
  this->chkExts = other->chkExts + this->chkExts;
  this->oneReplyExts = other->oneReplyExts + this->oneReplyExts;
  this->hashExts = other->hashExts + this->hashExts;
  this->execs = other->execs + this->execs;
  this->qexecs = other->qexecs + this->qexecs;
  this->deltaCount = other->deltaCount + this->deltaCount;
  this->staticNM = other->staticNM + this->staticNM;
  this->rzrCount = other->rzrCount + this->rzrCount;
  this->rzrEarlyOut = other->rzrEarlyOut + this->rzrEarlyOut;
  this->rzrCutoffs = other->rzrCutoffs + this->rzrCutoffs;
  this->iidCount = other->iidCount + this->iidCount;
  this->nullMoves = other->nullMoves + this->nullMoves;
  this->nmCutoffs = other->nmCutoffs + this->nmCutoffs;
  this->nmrCandidates = other->nmrCandidates + this->nmrCandidates;
  this->nmReductions = other->nmReductions + this->nmReductions;
  this->nmrBackfires = other->nmrBackfires + this->nmrBackfires;
  this->lateMoves = other->lateMoves + this->lateMoves;
  this->lmCandidates = other->lmCandidates + this->lmCandidates;
  this->lmReductions = other->lmReductions + this->lmReductions;
  this->lmResearches = other->lmResearches + this->lmResearches;
  this->lmConfirmed = other->lmConfirmed + this->lmConfirmed;
  this->lmAlphaIncs = other->lmAlphaIncs + this->lmAlphaIncs;
  return this;
}

Assistant:

Stats& Stats::operator+=(const Stats& other) {
  statCount     += 1;
  ttGets        += other.ttGets;
  ttHits        += other.ttHits;
  ttMates       += other.ttMates;
  ttStales      += other.ttStales;
  ptGets        += other.ptGets;
  ptHits        += other.ptHits;
  snodes        += other.snodes;
  qnodes        += other.qnodes;
  chkExts       += other.chkExts;
  oneReplyExts  += other.oneReplyExts;
  hashExts      += other.hashExts;
  execs         += other.execs;
  qexecs        += other.qexecs;
  deltaCount    += other.deltaCount;
  staticNM      += other.staticNM;
  rzrCount      += other.rzrCount;
  rzrEarlyOut   += other.rzrEarlyOut;
  rzrCutoffs    += other.rzrCutoffs;
  iidCount      += other.iidCount;
  nullMoves     += other.nullMoves;
  nmCutoffs     += other.nmCutoffs;
  nmrCandidates += other.nmrCandidates;
  nmReductions  += other.nmReductions;
  nmrBackfires  += other.nmrBackfires;
  lateMoves     += other.lateMoves;
  lmCandidates  += other.lmCandidates;
  lmReductions  += other.lmReductions;
  lmResearches  += other.lmResearches;
  lmConfirmed   += other.lmConfirmed;
  lmAlphaIncs   += other.lmAlphaIncs;
  return *this;
}